

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O1

void timer_cb(uv_timer_t *handle)

{
  int iVar1;
  uv_timer_t *in_RSI;
  
  if (handle == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    uv_close(&timer,0);
    return;
  }
  timer_cb_cold_1();
  if (in_RSI == (uv_timer_t *)magic_cookie) {
    in_RSI = handle;
    if (handle == &timer) {
      seen_timer_handle = seen_timer_handle + 1;
      return;
    }
  }
  else {
    walk_cb_cold_1();
  }
  walk_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(in_RSI,0);
  return;
}

Assistant:

static void timer_cb(uv_timer_t* h) {
  ASSERT_PTR_EQ(h, &timer);
  timer_cb_called++;
  uv_close((uv_handle_t*) &client, close_cb);
  if (can_recverr)
    uv_close((uv_handle_t*) &client2, close_cb);
  uv_close((uv_handle_t*) h, close_cb);
}